

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall google::protobuf::Message::PrintDebugString(Message *this)

{
  FieldReporterLevel in_R8D;
  string local_28;
  
  internal::StringifyMessage_abi_cxx11_(&local_28,(internal *)this,(Message *)0x0,0xc,in_R8D);
  printf("%s",local_28._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Message::PrintDebugString() const { printf("%s", DebugString().c_str()); }